

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Freudenthal_triangulation.h
# Opt level: O2

void __thiscall
Gudhi::coxeter_triangulation::
Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
::Freudenthal_triangulation
          (Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
           *this,uint dimension,Matrix *matrix,Vector *offset)

{
  invalid_argument *this_00;
  
  this->dimension_ = dimension;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->matrix_,
             (DenseStorage<double,__1,__1,__1,_0> *)matrix);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&this->offset_,
             (DenseStorage<double,__1,__1,_1,_0> *)offset);
  Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->colpivhouseholderqr_
             ,(EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->matrix_);
  this->is_freudenthal_ = false;
  if ((this->offset_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows == (ulong)dimension) {
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Offset must be of size \'dimension\'");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Freudenthal_triangulation(unsigned dimension, const Matrix& matrix, const Vector& offset)
      : dimension_(dimension),
        matrix_(matrix),
        offset_(offset),
        colpivhouseholderqr_(matrix_.colPivHouseholderQr()),
        is_freudenthal_(false) {
    GUDHI_CHECK(dimension == offset_.size(), std::invalid_argument("Offset must be of size 'dimension'"));
  }